

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::TryGenerateFastBrEq(Lowerer *this,Instr *instr)

{
  bool bVar1;
  RegOpnd *opnd;
  RegOpnd *opnd_00;
  BranchInstr *pBVar2;
  Opnd *pOVar3;
  Lowerer *this_00;
  
  bVar1 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (bVar1) {
    opnd = IR::Opnd::AsRegOpnd(instr->m_src1);
  }
  else {
    opnd = (RegOpnd *)0x0;
  }
  this_00 = (Lowerer *)instr->m_src2;
  bVar1 = IR::Opnd::IsRegOpnd((Opnd *)this_00);
  if (bVar1) {
    this_00 = (Lowerer *)instr->m_src2;
    opnd_00 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
  }
  else {
    opnd_00 = (RegOpnd *)0x0;
  }
  if (opnd == (RegOpnd *)0x0) {
LAB_005637a6:
    if (opnd_00 != (RegOpnd *)0x0) {
      bVar1 = IsNullOrUndefRegOpnd(this_00,opnd_00);
      if (bVar1) goto LAB_005637b7;
    }
    bVar1 = false;
  }
  else {
    bVar1 = IsNullOrUndefRegOpnd(this_00,opnd);
    if (!bVar1) goto LAB_005637a6;
    IR::Instr::SwapOpnds(instr);
LAB_005637b7:
    pBVar2 = IR::Instr::AsBranchInstr(instr);
    pOVar3 = LoadLibraryValueOpnd(this,instr,ValueNull);
    GenerateFastBrConst(this,pBVar2,pOVar3,true);
    pBVar2 = IR::Instr::AsBranchInstr(instr);
    pOVar3 = LoadLibraryValueOpnd(this,instr,ValueUndefined);
    GenerateFastBrConst(this,pBVar2,pOVar3,true);
    IR::Instr::Remove(instr);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
Lowerer::TryGenerateFastBrEq(IR::Instr * instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    bool isConst = false;
    if (srcReg1 && this->IsNullOrUndefRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        isConst = true;
    }

    // Fast path for == null or == undefined
    // if (src == null || src == undefined)
    if (isConst || (srcReg2 && this->IsNullOrUndefRegOpnd(srcReg2)))
    {
        IR::BranchInstr *newBranch;
        newBranch = this->GenerateFastBrConst(instr->AsBranchInstr(),
            this->LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
            true);

        this->GenerateFastBrConst(instr->AsBranchInstr(),
            this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined),
            true);

        instr->Remove();
        return true;
    }

    return false;
}